

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitSIMDShuffle(BinaryInstWriter *this,SIMDShuffle *curr)

{
  BufferWithRandomAccess *this_00;
  long lVar1;
  
  this_00 = BufferWithRandomAccess::operator<<(this->o,-3);
  BufferWithRandomAccess::operator<<(this_00,(U32LEB)0xd);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    BufferWithRandomAccess::operator<<(this->o,(curr->mask)._M_elems[lVar1]);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDShuffle(SIMDShuffle* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix) << U32LEB(BinaryConsts::I8x16Shuffle);
  for (uint8_t m : curr->mask) {
    o << m;
  }
}